

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManFindOneUnate(word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t **vUnateLits,
                       Vec_Int_t **vNotUnateVars,int fVerbose)

{
  int iVar1;
  int extraout_EDX;
  int extraout_EDX_00;
  Vec_Ptr_t *pOn;
  ulong uVar2;
  
  pOn = vDivs;
  if (fVerbose != 0) {
    printf("  ");
  }
  uVar2 = 0;
  do {
    Gia_ManFindOneUnateInt
              (pSets[uVar2],(word *)pOn,vDivs,nWords,vUnateLits[uVar2],vNotUnateVars[uVar2]);
    iVar1 = extraout_EDX;
    if (fVerbose != 0) {
      pOn = (Vec_Ptr_t *)(uVar2 & 0xffffffff);
      printf("U%d =%4d ",pOn,(ulong)(uint)vUnateLits[uVar2]->nSize);
      iVar1 = extraout_EDX_00;
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 == 1);
  iVar1 = Gia_ManFindFirstCommonLit(*vUnateLits,vUnateLits[1],iVar1);
  return iVar1;
}

Assistant:

int Gia_ManFindOneUnate( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnateLits[2], Vec_Int_t * vNotUnateVars[2], int fVerbose )
{
    int n;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManFindOneUnateInt( pSets[n], pSets[!n], vDivs, nWords, vUnateLits[n], vNotUnateVars[n] );
        if ( fVerbose ) printf( "U%d =%4d ", n, Vec_IntSize(vUnateLits[n]) );
    }
    return Gia_ManFindFirstCommonLit( vUnateLits[0], vUnateLits[1], fVerbose );
}